

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::UpdateActiveFunctionSet
          (FunctionBody *this,ActiveFunctionSet *pActiveFuncs,
          FunctionCodeGenRuntimeData *callSiteData)

{
  Type *pTVar1;
  bool bVar2;
  ProfileId PVar3;
  uint uVar4;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar5;
  FunctionBody *pFVar6;
  
  if (callSiteData != (FunctionCodeGenRuntimeData *)0x0) {
    pTVar1 = (callSiteData->inlinees).ptr;
    pFVar6 = this;
    if (pTVar1 != (Type *)0x0) {
      UpdateActiveFunctionsForOneDataSet
                (this,pActiveFuncs,callSiteData,pTVar1,(uint)this->profiledCallSiteCount);
    }
    pTVar1 = (callSiteData->ldFldInlinees).ptr;
    if (pTVar1 != (Type *)0x0) {
      pFVar6 = this;
      uVar4 = GetInlineCacheCount(this);
      UpdateActiveFunctionsForOneDataSet(pFVar6,pActiveFuncs,callSiteData,pTVar1,uVar4);
    }
    pTVar1 = (callSiteData->callbackInlinees).ptr;
    if (pTVar1 != (Type *)0x0) {
      UpdateActiveFunctionsForOneDataSet
                (pFVar6,pActiveFuncs,callSiteData,pTVar1,(uint)this->profiledCallSiteCount);
    }
    pTVar1 = (callSiteData->callApplyTargetInlinees).ptr;
    if (pTVar1 != (Type *)0x0) {
      pFVar6 = this;
      PVar3 = GetProfiledCallApplyCallSiteCount(this);
      UpdateActiveFunctionsForOneDataSet(pFVar6,pActiveFuncs,callSiteData,pTVar1,(uint)PVar3);
    }
  }
  bVar2 = TestAndUpdateActiveFunctions(this,pActiveFuncs);
  if (!bVar2) {
    pFVar6 = this;
    pWVar5 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)11,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                       ((FunctionProxy *)this);
    if (pWVar5 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
      UpdateActiveFunctionsForOneDataSet
                (pFVar6,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pWVar5,
                 (uint)this->profiledCallSiteCount);
    }
    pWVar5 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)8,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                       ((FunctionProxy *)this);
    if (pWVar5 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
      pFVar6 = this;
      uVar4 = GetInlineCacheCount(this);
      UpdateActiveFunctionsForOneDataSet
                (pFVar6,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pWVar5,uVar4);
    }
    pFVar6 = this;
    pWVar5 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)24,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                       ((FunctionProxy *)this);
    if (pWVar5 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
      UpdateActiveFunctionsForOneDataSet
                (pFVar6,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pWVar5,
                 (uint)this->profiledCallSiteCount);
    }
    pWVar5 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)26,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                       ((FunctionProxy *)this);
    if (pWVar5 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
      PVar3 = GetProfiledCallApplyCallSiteCount(this);
      UpdateActiveFunctionsForOneDataSet
                (this,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pWVar5,(uint)PVar3);
      return;
    }
  }
  return;
}

Assistant:

void FunctionBody::UpdateActiveFunctionSet(ActiveFunctionSet *pActiveFuncs, FunctionCodeGenRuntimeData *callSiteData) const
    {
        // Always walk the inlinee and ldFldInlinee data (if we have them), as they are different at each call site.
        if (callSiteData)
        {
            if (callSiteData->GetInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetInlinees(), this->GetProfiledCallSiteCount());
            }
            if (callSiteData->GetLdFldInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetLdFldInlinees(), this->GetInlineCacheCount());
            }
            if (callSiteData->GetCallbackInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetCallbackInlinees(), this->GetProfiledCallSiteCount());
            }
            if (callSiteData->GetCallApplyTargetInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetCallApplyTargetInlinees(), this->GetProfiledCallApplyCallSiteCount());
            }
        }

        // Now walk the top-level data, but only do it once, since it's always the same.

        if (this->TestAndUpdateActiveFunctions(pActiveFuncs))
        {
            return;
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallSiteCount());
            }
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenGetSetRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetInlineCacheCount());
            }
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenCallbackRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallSiteCount());
            }
        }
        {
#if ENABLE_NATIVE_CODEGEN
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenCallApplyTargetRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallApplyCallSiteCount());
            }
#endif
        }
    }